

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-101.cpp
# Opt level: O3

void __thiscall
baryonyx::itm::
solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
::solver_inequalities_101coeff
          (solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
           *this,random_engine *rng_,int m_,int n_,cost_type *c_,
          vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
          *csts)

{
  value_bit_array<_1,_1> *this_00;
  pointer pmVar1;
  uint size;
  pointer pfVar2;
  byte bVar3;
  bool bVar4;
  ulong uVar5;
  int *piVar6;
  longdouble *plVar7;
  rc_data *__s;
  bound_factor *pbVar8;
  pointer pmVar9;
  undefined8 extraout_RAX;
  sparse_matrix<int> *this_01;
  int iVar10;
  undefined8 *puVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  *pvVar16;
  sparse_matrix<int> *psVar17;
  int index;
  ulong uVar18;
  pointer pfVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  string_view name;
  
  name._M_str = "solver_inequalities_101coeff";
  name._M_len = 0x1c;
  pvVar16 = csts;
  debug_logger<true>::debug_logger(&this->super_debug_logger<true>,name);
  this->rng = rng_;
  sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(&this->ap,csts,m_,n_);
  size = (this->ap).m_rows_values.m_length;
  uVar18 = (ulong)size << 4;
  plVar7 = (longdouble *)operator_new__(uVar18);
  memset(plVar7,0,uVar18);
  (this->P)._M_t.super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
  super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
  super__Head_base<0UL,_long_double_*,_false>._M_head_impl = plVar7;
  this_00 = &this->A;
  bit_array_impl::bit_array_impl(&this_00->super_bit_array_impl,size);
  pmVar9 = (csts->
           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar14 = (long)(csts->
                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pmVar9;
  uVar18 = (long)*(pointer *)
                  ((long)&(pmVar9->elements).
                          super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                          ._M_impl + 8) -
           *(long *)&(pmVar9->elements).
                     super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                     ._M_impl >> 3;
  if (lVar14 != 0x28) {
    auVar23 = vpmovsxbq_avx512f(ZEXT816(0x807060504030201));
    auVar24 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar25 = vpbroadcastq_avx512f(ZEXT816(0x28));
    auVar26 = vpbroadcastq_avx512f(ZEXT816(8));
    auVar27 = vpbroadcastq_avx512f();
    uVar18 = 0;
    auVar28 = vpbroadcastq_avx512f();
    do {
      auVar29 = vpbroadcastq_avx512f();
      auVar30 = vmovdqa64_avx512f(auVar27);
      vpmullq_avx512dq(auVar23,auVar25);
      uVar18 = uVar18 + 8;
      auVar23 = vpaddq_avx512f(auVar23,auVar26);
      auVar27 = vporq_avx512f(auVar29,auVar24);
      uVar5 = vpcmpuq_avx512f(auVar27,auVar28,2);
      auVar27 = vpgatherqq_avx512f(*(undefined8 *)
                                    ((long)((long)&(pmVar9->elements).
                                                                                                      
                                                  super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                                  ._M_impl + 8U) + (long)pvVar16));
      bVar3 = (byte)uVar5;
      auVar29._8_8_ = (ulong)((byte)(uVar5 >> 1) & 1) * auVar27._8_8_;
      auVar29._0_8_ = (ulong)(bVar3 & 1) * auVar27._0_8_;
      auVar29._16_8_ = (ulong)((byte)(uVar5 >> 2) & 1) * auVar27._16_8_;
      auVar29._24_8_ = (ulong)((byte)(uVar5 >> 3) & 1) * auVar27._24_8_;
      auVar29._32_8_ = (ulong)((byte)(uVar5 >> 4) & 1) * auVar27._32_8_;
      auVar29._40_8_ = (ulong)((byte)(uVar5 >> 5) & 1) * auVar27._40_8_;
      auVar29._48_8_ = (ulong)((byte)(uVar5 >> 6) & 1) * auVar27._48_8_;
      auVar29._56_8_ = (uVar5 >> 7) * auVar27._56_8_;
      auVar27 = vpgatherqq_avx512f(*(undefined8 *)
                                    ((long)&(pvVar16->
                                            super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                            )._M_impl.super__Vector_impl_data +
                                    (long)&(pmVar9->elements).
                                           super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                           ._M_impl));
      auVar31._8_8_ = (ulong)((byte)(uVar5 >> 1) & 1) * auVar27._8_8_;
      auVar31._0_8_ = (ulong)(bVar3 & 1) * auVar27._0_8_;
      auVar31._16_8_ = (ulong)((byte)(uVar5 >> 2) & 1) * auVar27._16_8_;
      auVar31._24_8_ = (ulong)((byte)(uVar5 >> 3) & 1) * auVar27._24_8_;
      auVar31._32_8_ = (ulong)((byte)(uVar5 >> 4) & 1) * auVar27._32_8_;
      auVar31._40_8_ = (ulong)((byte)(uVar5 >> 5) & 1) * auVar27._40_8_;
      auVar31._48_8_ = (ulong)((byte)(uVar5 >> 6) & 1) * auVar27._48_8_;
      auVar31._56_8_ = (uVar5 >> 7) * auVar27._56_8_;
      auVar27 = vpsubq_avx512f(auVar29,auVar31);
      auVar27 = vpsraq_avx512f(auVar27,3);
      auVar27 = vpmaxuq_avx512f(auVar30,auVar27);
    } while (((lVar14 >> 3) * -0x3333333333333333 + 6U & 0xfffffffffffffff8) != uVar18);
    auVar23 = vmovdqa64_avx512f(auVar27);
    auVar24._0_8_ = (ulong)(bVar3 & 1) * auVar23._0_8_ | (ulong)!(bool)(bVar3 & 1) * auVar30._0_8_;
    bVar4 = (bool)((byte)(uVar5 >> 1) & 1);
    auVar24._8_8_ = (ulong)bVar4 * auVar23._8_8_ | (ulong)!bVar4 * auVar30._8_8_;
    bVar4 = (bool)((byte)(uVar5 >> 2) & 1);
    auVar24._16_8_ = (ulong)bVar4 * auVar23._16_8_ | (ulong)!bVar4 * auVar30._16_8_;
    bVar4 = (bool)((byte)(uVar5 >> 3) & 1);
    auVar24._24_8_ = (ulong)bVar4 * auVar23._24_8_ | (ulong)!bVar4 * auVar30._24_8_;
    bVar4 = (bool)((byte)(uVar5 >> 4) & 1);
    auVar24._32_8_ = (ulong)bVar4 * auVar23._32_8_ | (ulong)!bVar4 * auVar30._32_8_;
    bVar4 = (bool)((byte)(uVar5 >> 5) & 1);
    auVar24._40_8_ = (ulong)bVar4 * auVar23._40_8_ | (ulong)!bVar4 * auVar30._40_8_;
    bVar4 = (bool)((byte)(uVar5 >> 6) & 1);
    auVar24._48_8_ = (ulong)bVar4 * auVar23._48_8_ | (ulong)!bVar4 * auVar30._48_8_;
    auVar24._56_8_ = (uVar5 >> 7) * auVar23._56_8_ | (ulong)!SUB81(uVar5 >> 7,0) * auVar30._56_8_;
    auVar22 = vextracti64x4_avx512f(auVar24,1);
    auVar23 = vpmaxuq_avx512f(auVar24,ZEXT3264(auVar22));
    auVar20 = vpmaxuq_avx512vl(auVar23._0_16_,auVar23._16_16_);
    auVar21 = vpshufd_avx(auVar20,0xee);
    auVar21 = vpmaxuq_avx512vl(auVar20,auVar21);
    uVar18 = auVar21._0_8_;
  }
  uVar18 = -(ulong)(uVar18 >> 0x3b != 0) | uVar18 << 5;
  __s = (rc_data *)operator_new__(uVar18);
  memset(__s,0,uVar18);
  (this->R)._M_t.
  super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
  .
  super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_false>
  ._M_head_impl = __s;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = (long)m_;
  uVar18 = SUB168(auVar21 * ZEXT816(0xc),0);
  if (SUB168(auVar21 * ZEXT816(0xc),8) != 0) {
    uVar18 = 0xffffffffffffffff;
  }
  pbVar8 = (bound_factor *)operator_new__(uVar18);
  memset(pbVar8,0,uVar18);
  uVar18 = (long)m_ << 4;
  (this->b)._M_t.
  super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::bound_factor[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::bound_factor[]>_>
  .
  super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::bound_factor_*,_false>
  ._M_head_impl = pbVar8;
  if (m_ < 0) {
    uVar18 = 0xffffffffffffffff;
  }
  plVar7 = (longdouble *)operator_new__(uVar18);
  index = 0;
  memset(plVar7,0,uVar18);
  (this->pi)._M_t.super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
  super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
  super__Head_base<0UL,_long_double_*,_false>._M_head_impl = plVar7;
  this->c = c_;
  this->m = m_;
  this->n = n_;
  pmVar9 = (csts->
           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar18 = ((long)(csts->
                  super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pmVar9 >> 3) *
           -0x3333333333333333;
  if ((int)uVar18 != 0) {
    this_01 = (sparse_matrix<int> *)(uVar18 & 0xffffffff);
    psVar17 = (sparse_matrix<int> *)0x0;
    do {
      pfVar19 = *(pointer *)
                 &pmVar9[(long)psVar17].elements.
                  super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                  ._M_impl;
      pfVar2 = *(pointer *)
                ((long)&pmVar9[(long)psVar17].elements.
                        super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                        ._M_impl + 8);
      if (pfVar19 == pfVar2) {
        puVar11 = (undefined8 *)0x0;
        iVar12 = 0;
      }
      else {
        iVar12 = 0;
        puVar11 = (undefined8 *)0x0;
        do {
          if ((pfVar19->factor + 1U & 0xfffffffd) != 0) {
            itm::solver_inequalities_101coeff();
            goto LAB_004b3a6d;
          }
          if (pfVar19->factor < 1) {
            bit_array_impl::unset(&this_00->super_bit_array_impl,index);
          }
          else {
            bit_array_impl::set(&this_00->super_bit_array_impl,index);
          }
          index = index + 1;
          piVar6 = &pfVar19->factor;
          pfVar19 = pfVar19 + 1;
          puVar11 = (undefined8 *)(ulong)((int)puVar11 + (uint)(0 < *piVar6));
          iVar12 = iVar12 + (uint)(*piVar6 < 1);
        } while (pfVar19 != pfVar2);
        pmVar9 = (csts->
                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      }
      pmVar1 = pmVar9 + (long)psVar17;
      iVar15 = pmVar1->min;
      iVar10 = (int)puVar11;
      if (iVar15 == pmVar1->max) {
        pbVar8 = (this->b)._M_t.
                 super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::bound_factor[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::bound_factor[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::bound_factor_*,_false>
                 ._M_head_impl;
        pbVar8[(long)psVar17].min = iVar15;
        pbVar8[(long)psVar17].max = iVar15;
        pbVar8[(long)psVar17].negative_factor = iVar12;
      }
      else {
        iVar13 = -iVar12;
        if (iVar15 != iVar13 && SBORROW4(iVar15,iVar13) == iVar15 + iVar12 < 0) {
          iVar13 = iVar15;
        }
        pbVar8 = (this->b)._M_t.
                 super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::bound_factor[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::bound_factor[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::bound_factor_*,_false>
                 ._M_head_impl;
        pbVar8[(long)psVar17].min = iVar13;
        iVar15 = pmVar1->max;
        if (iVar10 <= pmVar1->max) {
          iVar15 = iVar10;
        }
        pbVar8[(long)psVar17].max = iVar15;
        pbVar8[(long)psVar17].negative_factor = iVar12;
        if (iVar15 < iVar13) {
LAB_004b3a6d:
          itm::solver_inequalities_101coeff();
          goto LAB_004b3a72;
        }
      }
      if (iVar12 + iVar10 !=
          (int)((ulong)((long)*(pointer *)
                               ((long)&(pmVar1->elements).
                                       super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                       ._M_impl + 8) -
                       *(long *)&(pmVar1->elements).
                                 super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                 ._M_impl) >> 3)) {
LAB_004b3a72:
        itm::solver_inequalities_101coeff();
        operator_delete__(pfVar2);
        puVar11[0xe] = 0;
        if ((void *)puVar11[0xd] != (void *)0x0) {
          operator_delete__((void *)puVar11[0xd]);
        }
        puVar11[0xd] = 0;
        if ((void *)puVar11[0xc] != (void *)0x0) {
          operator_delete__((void *)puVar11[0xc]);
        }
        puVar11[0xc] = 0;
        if ((void *)puVar11[10] != (void *)0x0) {
          operator_delete__((void *)puVar11[10]);
        }
        puVar11[10] = 0;
        sparse_matrix<int>::~sparse_matrix(this_01);
        if ((FILE *)*puVar11 != (FILE *)0x0) {
          fclose((FILE *)*puVar11);
        }
        _Unwind_Resume(extraout_RAX);
      }
      psVar17 = (sparse_matrix<int> *)
                ((long)&(psVar17->m_rows_access).m_buffer._M_t.
                        super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                        super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                        super__Head_base<0UL,_int_*,_false> + 1);
    } while (psVar17 != this_01);
  }
  return;
}

Assistant:

solver_inequalities_101coeff(random_engine& rng_,
                                 int m_,
                                 int n_,
                                 const cost_type& c_,
                                 const std::vector<merged_constraint>& csts)
      : logger("solver_inequalities_101coeff")
      , rng(rng_)
      , ap(csts, m_, n_)
      , P(std::make_unique<Float[]>(ap.size()))
      , A(static_cast<int>(ap.size()))
      , R(std::make_unique<rc_data[]>(compute_reduced_costs_vector_size(csts)))
      , b(std::make_unique<bound_factor[]>(m_))
      , pi(std::make_unique<Float[]>(m_))
      , c(c_)
      , m(m_)
      , n(n_)
    {
        int id = 0;
        for (int i = 0, e = length(csts); i != e; ++i) {
            int lower = 0, upper = 0;

            for (const auto& cst : csts[i].elements) {
                bx_ensures(std::abs(cst.factor) == 1);

                if (cst.factor > 0)
                    A.set(id++);
                else
                    A.unset(id++);

                if (cst.factor > 0)
                    upper++;
                else
                    lower++;
            }

            if (csts[i].min == csts[i].max) {
                b[i].min = csts[i].min;
                b[i].max = csts[i].max;
            } else {
                b[i].min = std::max(-lower, csts[i].min);
                b[i].max = std::min(upper, csts[i].max);
            }

            b[i].negative_factor = lower;

            bx_ensures(b[i].min <= b[i].max);
            bx_ensures(upper + lower == length(csts[i].elements));
        }
    }